

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicGLSLConst::Run(BasicGLSLConst *this)

{
  undefined8 src_vs_00;
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  GLuint GVar2;
  GLint GVar3;
  int w;
  int h;
  RenderContext *pRVar4;
  ostream *poVar5;
  char *src_fs_00;
  CallLogWrapper *pCVar6;
  char *local_210;
  Vector<float,_4> local_1ec;
  GLint local_1dc;
  string local_1d8 [4];
  GLint i;
  undefined1 local_1a8 [8];
  ostringstream src_fs;
  char *src_vs;
  bool isAtLeast44Context;
  BasicGLSLConst *this_local;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,4);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  src_fs._368_8_ = anon_var_dwarf_2592ca;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar5 = std::operator<<((ostream *)local_1a8,"#version ");
  if (bVar1) {
    local_210 = "#version 440";
  }
  else {
    local_210 = "#version 420";
  }
  local_210 = local_210 + 9;
  poVar5 = std::operator<<(poVar5,local_210);
  std::operator<<(poVar5," core");
  std::operator<<((ostream *)local_1a8,
                  "\nlayout(location = 0) out vec4 o_color;\nuniform int MaxImageUnits;\nuniform int MaxCombinedShaderOutputResources;\nuniform int MaxImageSamples;\nuniform int MaxVertexImageUniforms;\nuniform int MaxTessControlImageUniforms;\nuniform int MaxTessEvaluationImageUniforms;\nuniform int MaxGeometryImageUniforms;\nuniform int MaxFragmentImageUniforms;\nuniform int MaxCombinedImageUniforms;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  if (gl_MaxImageUnits != MaxImageUnits) o_color = vec4(1.0, 0.0, 0.0, 0.1);"
                 );
  if (bVar1) {
    std::operator<<((ostream *)local_1a8,
                    "\n  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = vec4(0.2, 0.0, 0.0, 0.2);"
                   );
  }
  else {
    std::operator<<((ostream *)local_1a8,
                    "\n  if (gl_MaxCombinedImageUnitsAndFragmentOutputs != MaxCombinedShaderOutputResources) o_color = vec4(0.2, 0.0, 0.0, 0.2);"
                   );
  }
  std::operator<<((ostream *)local_1a8,
                  "\n  if (gl_MaxImageSamples != MaxImageSamples) o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  if (gl_MaxTessControlImageUniforms != MaxTessControlImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  if (gl_MaxTessEvaluationImageUniforms != MaxTessEvaluationImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  if (gl_MaxGeometryImageUniforms != MaxGeometryImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.8);\n  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.9);\n}"
                 );
  src_vs_00 = src_fs._368_8_;
  std::__cxx11::ostringstream::str();
  src_fs_00 = (char *)std::__cxx11::string::c_str();
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,(char *)src_vs_00,(char *)0x0,(char *)0x0
                     ,(char *)0x0,src_fs_00,(bool *)0x0);
  this->m_program = GVar2;
  std::__cxx11::string::~string(local_1d8);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8f38,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar6,this->m_program,"MaxImageUnits");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8f39,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (pCVar6,this->m_program,"MaxCombinedShaderOutputResources");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x906d,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar6,this->m_program,"MaxImageSamples");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90ca,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar6,this->m_program,"MaxVertexImageUniforms")
  ;
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90cb,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (pCVar6,this->m_program,"MaxTessControlImageUniforms");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90cc,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (pCVar6,this->m_program,"MaxTessEvaluationImageUniforms");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90cd,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (pCVar6,this->m_program,"MaxGeometryImageUniforms");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90ce,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (pCVar6,this->m_program,"MaxFragmentImageUniforms");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90cf,&local_1dc);
  pCVar6 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (pCVar6,this->m_program,"MaxCombinedImageUniforms");
  glu::CallLogWrapper::glUniform1i(pCVar6,GVar3,local_1dc);
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glClear
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,0,4);
  w = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
  h = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
  tcu::Vector<float,_4>::Vector(&local_1ec,0.0,1.0,0.0,1.0);
  bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0,0,w,h,&local_1ec);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (BasicGLSLConst *)0x0;
  }
  else {
    this_local = (BasicGLSLConst *)&DAT_ffffffffffffffff;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool isAtLeast44Context =
			glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 4));

		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		std::ostringstream src_fs;
		src_fs << "#version " << (isAtLeast44Context ? "440" : "420") << " core";
		src_fs << NL "layout(location = 0) out vec4 o_color;" NL "uniform int MaxImageUnits;" NL
					 "uniform int MaxCombinedShaderOutputResources;" NL "uniform int MaxImageSamples;" NL
					 "uniform int MaxVertexImageUniforms;" NL "uniform int MaxTessControlImageUniforms;" NL
					 "uniform int MaxTessEvaluationImageUniforms;" NL "uniform int MaxGeometryImageUniforms;" NL
					 "uniform int MaxFragmentImageUniforms;" NL "uniform int MaxCombinedImageUniforms;" NL
					 "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL
					 "  if (gl_MaxImageUnits != MaxImageUnits) o_color = vec4(1.0, 0.0, 0.0, 0.1);";
		if (isAtLeast44Context)
			src_fs << NL "  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = "
						 "vec4(0.2, 0.0, 0.0, 0.2);";
		else
			src_fs << NL "  if (gl_MaxCombinedImageUnitsAndFragmentOutputs != MaxCombinedShaderOutputResources) "
						 "o_color = vec4(0.2, 0.0, 0.0, 0.2);";
		src_fs << NL
			"  if (gl_MaxImageSamples != MaxImageSamples) o_color = vec4(1.0, 0.0, 0.0, 0.3);" NL
			"  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.4);" NL
			"  if (gl_MaxTessControlImageUniforms != MaxTessControlImageUniforms) o_color = vec4(1.0, 0.0, 0.0, "
			"0.5);" NL "  if (gl_MaxTessEvaluationImageUniforms != MaxTessEvaluationImageUniforms) o_color = vec4(1.0, "
			"0.0, 0.0, 0.6);" NL
			"  if (gl_MaxGeometryImageUniforms != MaxGeometryImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.7);" NL
			"  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.8);" NL
			"  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = vec4(1.0, 0.0, 0.0, 0.9);" NL "}";

		m_program = BuildProgram(src_vs, NULL, NULL, NULL, src_fs.str().c_str());
		glUseProgram(m_program);

		GLint i;
		glGetIntegerv(GL_MAX_IMAGE_UNITS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxImageUnits"), i);

		glGetIntegerv(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedShaderOutputResources"), i);

		glGetIntegerv(GL_MAX_IMAGE_SAMPLES, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxImageSamples"), i);

		glGetIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxVertexImageUniforms"), i);

		glGetIntegerv(GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxTessControlImageUniforms"), i);

		glGetIntegerv(GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxTessEvaluationImageUniforms"), i);

		glGetIntegerv(GL_MAX_GEOMETRY_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxGeometryImageUniforms"), i);

		glGetIntegerv(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxFragmentImageUniforms"), i);

		glGetIntegerv(GL_MAX_COMBINED_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedImageUniforms"), i);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}